

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_signal_to_child_closed(void)

{
  int iVar1;
  __pid_t __pid;
  uv_loop_t *puVar2;
  ssize_t sVar3;
  char sync_buf [1];
  int sync_pipe2 [2];
  int sync_pipe [2];
  uv_signal_t signal_handle;
  undefined1 local_b1;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  uv_signal_t local_a0;
  
  fork_signal_cb_called = 0;
  iVar1 = pipe(&local_a8);
  if (iVar1 == 0) {
    iVar1 = pipe(&local_b0);
    if (iVar1 != 0) goto LAB_0014cde6;
    run_timer_loop_once();
    puVar2 = uv_default_loop();
    iVar1 = uv_signal_init(puVar2,&local_a0);
    if (iVar1 != 0) goto LAB_0014cdeb;
    iVar1 = uv_signal_start(&local_a0,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_0014cdf0;
    __pid = fork();
    if (__pid == 0) goto LAB_0014cdf5;
    if (__pid == -1) goto LAB_0014ce28;
    puts("Wating on child in parent");
    sVar3 = read(local_a8,&local_b1,1);
    if (sVar3 != 1) goto LAB_0014ce2d;
    puts("Parent killing child");
    iVar1 = kill(__pid,10);
    if (iVar1 != 0) goto LAB_0014ce32;
    puts("Running loop in parent");
    uv_unref((uv_handle_t *)&local_a0);
    run_timer_loop_once();
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_0014ce37;
    printf("Signal in parent %d\n",(ulong)(uint)fork_signal_cb_called);
    if (fork_signal_cb_called != 0) goto LAB_0014ce3c;
    sVar3 = write(local_ac,"1",1);
    if (sVar3 != 1) goto LAB_0014ce41;
    puts("Waiting for child in parent");
    assert_wait_child(__pid);
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
LAB_0014ce46:
    run_test_fork_signal_to_child_closed_cold_16();
LAB_0014ce4b:
    run_test_fork_signal_to_child_closed_cold_5();
  }
  else {
    run_test_fork_signal_to_child_closed_cold_1();
LAB_0014cde6:
    run_test_fork_signal_to_child_closed_cold_2();
LAB_0014cdeb:
    run_test_fork_signal_to_child_closed_cold_3();
LAB_0014cdf0:
    run_test_fork_signal_to_child_closed_cold_4();
LAB_0014cdf5:
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(puVar2);
    if (iVar1 != 0) goto LAB_0014ce4b;
    puts("Checking loop in child");
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 == 0) {
      run_test_fork_signal_to_child_closed_cold_9();
LAB_0014ce28:
      run_test_fork_signal_to_child_closed_cold_10();
LAB_0014ce2d:
      run_test_fork_signal_to_child_closed_cold_11();
LAB_0014ce32:
      run_test_fork_signal_to_child_closed_cold_12();
LAB_0014ce37:
      run_test_fork_signal_to_child_closed_cold_13();
LAB_0014ce3c:
      run_test_fork_signal_to_child_closed_cold_14();
LAB_0014ce41:
      run_test_fork_signal_to_child_closed_cold_15();
      goto LAB_0014ce46;
    }
  }
  puts("Alerting parent in child");
  sVar3 = write(local_a4,"1",1);
  if (sVar3 == 1) {
    puts("Waiting on parent in child");
    sVar3 = read(local_b0,&local_b1,1);
    if ((int)sVar3 + 1U < 3) {
      if (fork_signal_cb_called == 0) {
        puts("Exiting child ");
        exit(0);
      }
      goto LAB_0014cec3;
    }
  }
  else {
    run_test_fork_signal_to_child_closed_cold_6();
  }
  run_test_fork_signal_to_child_closed_cold_7();
LAB_0014cec3:
  run_test_fork_signal_to_child_closed_cold_8();
  _do_fork_fs_events_child(0);
  return 0;
}

Assistant:

TEST_IMPL(fork_signal_to_child_closed) {
  /* A signal handler installed before forking
     doesn't get received anywhere when the child is signalled,
     but isnt running the loop. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  int sync_pipe2[2];
  char sync_buf[1];
  int r;

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));
  ASSERT(0 == pipe(sync_pipe2));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    printf("Wating on child in parent\n");
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    printf("Parent killing child\n");
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle); /* so the loop can exit;
                                               we *shouldn't* get any signals */
    run_timer_loop_once(); /* but while we share a pipe, we do, so
                              have something active. */
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    printf("Signal in parent %d\n", fork_signal_cb_called);
    ASSERT(0 == fork_signal_cb_called);
    ASSERT(1 == write(sync_pipe2[1], "1", 1)); /* alert child */
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* Child. Our signal handler should still be installed. */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    printf("Checking loop in child\n");
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Alerting parent in child\n");
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Don't run the loop. Wait for the parent to call us */
    printf("Waiting on parent in child\n");
    /* Wait for parent. read may fail if the parent tripped an ASSERT
       and exited, so this ASSERT is generous.
    */
    r = read(sync_pipe2[0], sync_buf, 1);
    ASSERT(-1 <= r && r <= 1);
    ASSERT(0 == fork_signal_cb_called);
    printf("Exiting child \n");
    /* Note that we're deliberately not running the loop
     * in the child, and also not closing the loop's handles,
     * so the child default loop can't be cleanly closed.
     * We need to explicitly exit to avoid an automatic failure
     * in that case.
     */
    exit(0);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}